

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

_Bool str_to_uint32_t(char *s,uint32_t *out)

{
  _Bool _Var1;
  char *in_RAX;
  ulong uVar2;
  char *endptr;
  
  endptr = in_RAX;
  uVar2 = strtoul(s,&endptr,10);
  if ((*s == '\0') || (uVar2 >> 0x20 != 0 || *endptr != '\0')) {
    _Var1 = false;
  }
  else {
    *out = (uint32_t)uVar2;
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

static bool str_to_uint32_t(const char *s, uint32_t *out)
{
    char *endptr;
    unsigned long converted = strtoul(s, &endptr, 10);
    if (*s && !*endptr && converted <= ~(uint32_t)0) {
        *out = converted;
        return true;
    } else {
        return false;
    }
}